

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O0

bool duckdb::FromDecimalCast<signed_char>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  uint8_t uVar1;
  uint8_t uVar2;
  PhysicalType PVar3;
  Vector *source_00;
  InternalException *this;
  Vector *in_RDI;
  uint8_t scale;
  uint8_t width;
  LogicalType *source_type;
  string *in_stack_ffffffffffffff78;
  LogicalType *in_stack_ffffffffffffff80;
  allocator local_59;
  string local_58 [14];
  uint8_t in_stack_ffffffffffffffb6;
  uint8_t in_stack_ffffffffffffffb7;
  CastParameters *in_stack_ffffffffffffffb8;
  idx_t in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  bool local_1;
  
  source_00 = (Vector *)Vector::GetType(in_RDI);
  uVar1 = DecimalType::GetWidth(in_stack_ffffffffffffff80);
  uVar2 = DecimalType::GetScale(in_stack_ffffffffffffff80);
  PVar3 = LogicalType::InternalType((LogicalType *)source_00);
  if (PVar3 == INT128) {
    local_1 = VectorCastHelpers::
              TemplatedDecimalCast<duckdb::hugeint_t,signed_char,duckdb::TryCastFromDecimal>
                        (source_00,
                         (Vector *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffffc8)),
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb6);
  }
  else if (PVar3 == INT16) {
    local_1 = VectorCastHelpers::TemplatedDecimalCast<short,signed_char,duckdb::TryCastFromDecimal>
                        (source_00,
                         (Vector *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffffc8)),
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb6);
  }
  else if (PVar3 == INT32) {
    local_1 = VectorCastHelpers::TemplatedDecimalCast<int,signed_char,duckdb::TryCastFromDecimal>
                        (source_00,
                         (Vector *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffffc8)),
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb6);
  }
  else {
    if (PVar3 != INT64) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_58,"Unimplemented internal type for decimal",&local_59);
      InternalException::InternalException(this,in_stack_ffffffffffffff78);
      __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
    }
    local_1 = VectorCastHelpers::TemplatedDecimalCast<long,signed_char,duckdb::TryCastFromDecimal>
                        (source_00,
                         (Vector *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffffc8)),
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb6);
  }
  return local_1;
}

Assistant:

static bool FromDecimalCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &source_type = source.GetType();
	auto width = DecimalType::GetWidth(source_type);
	auto scale = DecimalType::GetScale(source_type);
	switch (source_type.InternalType()) {
	case PhysicalType::INT16:
		return VectorCastHelpers::TemplatedDecimalCast<int16_t, T, TryCastFromDecimal>(source, result, count,
		                                                                               parameters, width, scale);
	case PhysicalType::INT32:
		return VectorCastHelpers::TemplatedDecimalCast<int32_t, T, TryCastFromDecimal>(source, result, count,
		                                                                               parameters, width, scale);
	case PhysicalType::INT64:
		return VectorCastHelpers::TemplatedDecimalCast<int64_t, T, TryCastFromDecimal>(source, result, count,
		                                                                               parameters, width, scale);
	case PhysicalType::INT128:
		return VectorCastHelpers::TemplatedDecimalCast<hugeint_t, T, TryCastFromDecimal>(source, result, count,
		                                                                                 parameters, width, scale);
	default:
		throw InternalException("Unimplemented internal type for decimal");
	}
}